

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

LinearSpace3fa * __thiscall
embree::avx::LineSegmentsISA::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t primID,
          BBox1f time_range)

{
  BBox1f BVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  vfloat4 b1;
  undefined1 auVar6 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar15;
  float fVar16;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 local_28 [16];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = time_range;
  BVar1 = (this->super_LineSegments).super_Geometry.time_range;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = BVar1.lower;
  auVar6._4_4_ = BVar1.upper;
  fVar9 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar16 = BVar1.lower;
  auVar6 = vmovshdup_avx(auVar6);
  fVar15 = auVar6._0_4_ - fVar16;
  auVar3 = vmovshdup_avx(auVar5._0_16_);
  auVar6 = ZEXT416((uint)(fVar9 * ((time_range.lower - fVar16) / fVar15) * 1.0000002));
  auVar6 = vroundss_avx(auVar6,auVar6,9);
  auVar6 = vmaxss_avx(ZEXT816(0),auVar6);
  auVar3 = ZEXT416((uint)(fVar9 * ((auVar3._0_4_ - fVar16) / fVar15) * 0.99999976));
  auVar3 = vroundss_avx(auVar3,auVar3,10);
  auVar3 = vminss_avx(auVar3,ZEXT416((uint)fVar9));
  if ((int)auVar3._0_4_ == (int)auVar6._0_4_) {
    auVar6 = vdpps_avx(_DAT_020214e0,_DAT_020214e0,0x7f);
    auVar10 = SUB6416(ZEXT464(0xbf800000),0);
    auVar3 = vdpps_avx(auVar10,auVar10,0x7f);
    auVar6 = vcmpps_avx(auVar3,auVar6,1);
    auVar6 = vshufps_avx(auVar6,auVar6,0);
    auVar6 = vblendvps_avx(auVar10,_DAT_020214e0,auVar6);
    auVar3 = vdpps_avx(auVar6,auVar6,0x7f);
    auVar10 = vrsqrtss_avx(auVar3,auVar3);
    fVar9 = auVar10._0_4_;
    auVar3 = ZEXT416((uint)(fVar9 * 1.5 + auVar3._0_4_ * -0.5 * fVar9 * fVar9 * fVar9));
    auVar3 = vshufps_avx(auVar3,auVar3,0);
    aVar7._0_4_ = auVar6._0_4_ * auVar3._0_4_;
    aVar7._4_4_ = auVar6._4_4_ * auVar3._4_4_;
    aVar7._8_4_ = auVar6._8_4_ * auVar3._8_4_;
    aVar7._12_4_ = auVar6._12_4_ * auVar3._12_4_;
    auVar11._0_4_ = aVar7._0_4_ * 1.0;
    auVar11._4_4_ = aVar7._4_4_ * 0.0;
    auVar11._8_4_ = aVar7._8_4_ * 0.0;
    auVar11._12_4_ = aVar7._12_4_ * 0.0;
    auVar6 = vshufps_avx(auVar11,auVar11,0xc9);
    auVar12._0_4_ = auVar6._0_4_ + aVar7._0_4_ * -0.0;
    auVar12._4_4_ = auVar6._4_4_ + aVar7._4_4_ * -1.0;
    auVar12._8_4_ = auVar6._8_4_ + aVar7._8_4_ * -0.0;
    auVar12._12_4_ = auVar6._12_4_ + aVar7._12_4_ * -0.0;
    aVar4 = _DAT_01fec700;
  }
  else {
    (*(this->super_LineSegments).super_Geometry.super_RefCount._vptr_RefCount[0x38])
              (local_28,this,primID,(long)(((int)auVar6._0_4_ + (int)auVar3._0_4_) / 2));
    auVar6 = vdpps_avx(local_28,local_28,0x7f);
    auVar3 = vrsqrtss_avx(auVar6,auVar6);
    fVar9 = auVar3._0_4_;
    auVar6 = ZEXT416((uint)(fVar9 * 1.5 + auVar6._0_4_ * -0.5 * fVar9 * fVar9 * fVar9));
    auVar6 = vshufps_avx(auVar6,auVar6,0);
    aVar4._0_4_ = local_28._0_4_ * auVar6._0_4_;
    aVar4._4_4_ = local_28._4_4_ * auVar6._4_4_;
    aVar4._8_4_ = local_28._8_4_ * auVar6._8_4_;
    aVar4._12_4_ = local_28._12_4_ * auVar6._12_4_;
    auVar3._8_4_ = 0xff7fffff;
    auVar3._0_8_ = 0xff7fffffff7fffff;
    auVar3._12_4_ = 0xff7fffff;
    auVar6 = vcmpps_avx((undefined1  [16])aVar4,auVar3,5);
    auVar10._8_4_ = 0x7f7fffff;
    auVar10._0_8_ = 0x7f7fffff7f7fffff;
    auVar10._12_4_ = 0x7f7fffff;
    auVar3 = vcmpps_avx((undefined1  [16])aVar4,auVar10,2);
    auVar6 = vandps_avx(auVar6,auVar3);
    uVar2 = vmovmskps_avx(auVar6);
    if ((~(byte)uVar2 & 7) != 0) {
      fVar9 = 0.0;
      fVar15 = 1.0;
      fVar16 = 0.0;
      fVar17 = 0.0;
      aVar7 = SUB6416(ZEXT464(0x3f800000),0);
      aVar4 = _DAT_01fec700;
      goto LAB_01326748;
    }
    auVar3 = vshufpd_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,1);
    auVar6 = vmovshdup_avx((undefined1  [16])aVar4);
    auVar18._8_4_ = 0x80000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar18._12_4_ = 0x80000000;
    auVar13._0_4_ = auVar6._0_4_ ^ 0x80000000;
    auVar6 = vunpckhps_avx((undefined1  [16])aVar4,ZEXT816(0) << 0x40);
    auVar13._4_12_ = ZEXT812(0) << 0x20;
    auVar12 = vshufps_avx(auVar6,auVar13,0x41);
    auVar8._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
    auVar8._8_8_ = auVar3._8_8_ ^ auVar18._8_8_;
    auVar10 = vinsertps_avx(auVar8,(undefined1  [16])aVar4,0x2a);
    auVar6 = vdpps_avx(auVar12,auVar12,0x7f);
    auVar3 = vdpps_avx(auVar10,auVar10,0x7f);
    auVar6 = vcmpps_avx(auVar3,auVar6,1);
    auVar6 = vshufps_avx(auVar6,auVar6,0);
    auVar6 = vblendvps_avx(auVar10,auVar12,auVar6);
    auVar3 = vdpps_avx(auVar6,auVar6,0x7f);
    auVar10 = vrsqrtss_avx(auVar3,auVar3);
    fVar9 = auVar10._0_4_;
    auVar3 = ZEXT416((uint)(fVar9 * 1.5 + auVar3._0_4_ * -0.5 * fVar9 * fVar9 * fVar9));
    auVar3 = vshufps_avx(auVar3,auVar3,0);
    aVar7._0_4_ = auVar6._0_4_ * auVar3._0_4_;
    aVar7._4_4_ = auVar6._4_4_ * auVar3._4_4_;
    aVar7._8_4_ = auVar6._8_4_ * auVar3._8_4_;
    aVar7._12_4_ = auVar6._12_4_ * auVar3._12_4_;
    auVar6 = vshufps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0xc9);
    auVar3 = vshufps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0xc9);
    auVar19._0_4_ = auVar3._0_4_ * aVar7._0_4_;
    auVar19._4_4_ = auVar3._4_4_ * aVar7._4_4_;
    auVar19._8_4_ = auVar3._8_4_ * aVar7._8_4_;
    auVar19._12_4_ = auVar3._12_4_ * aVar7._12_4_;
    auVar14._0_4_ = aVar4._0_4_ * auVar6._0_4_;
    auVar14._4_4_ = aVar4._4_4_ * auVar6._4_4_;
    auVar14._8_4_ = aVar4._8_4_ * auVar6._8_4_;
    auVar14._12_4_ = aVar4._12_4_ * auVar6._12_4_;
    auVar12 = vsubps_avx(auVar14,auVar19);
  }
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar6 = vdpps_avx(auVar10,auVar10,0x7f);
  auVar3 = vrsqrtss_avx(auVar6,auVar6);
  fVar9 = auVar3._0_4_;
  auVar6 = ZEXT416((uint)(fVar9 * 1.5 + auVar6._0_4_ * -0.5 * fVar9 * fVar9 * fVar9));
  auVar6 = vshufps_avx(auVar6,auVar6,0);
  fVar9 = auVar6._0_4_ * auVar10._0_4_;
  fVar15 = auVar6._4_4_ * auVar10._4_4_;
  fVar16 = auVar6._8_4_ * auVar10._8_4_;
  fVar17 = auVar6._12_4_ * auVar10._12_4_;
LAB_01326748:
  (__return_storage_ptr__->vx).field_0 = aVar7;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar9;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar15;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar16;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar17;
  (__return_storage_ptr__->vz).field_0 = aVar4;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t itime = (tbounds.begin()+tbounds.end())/2;

        const Vec3fa dir = normalize(computeDirection(primID,itime));
        if (is_finite(dir)) return frame(dir);
        else return LinearSpace3fa(one);
      }